

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetMonitorFrequency(void *cvode_mem,long nst)

{
  long in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetMonitorFrequency",
                   "cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI < 0) {
    cvProcessError((CVodeMem)0x0,-0x16,"CVODE","CVodeSetMonitorFrequency",
                   "step interval must be >= 0\n");
    local_4 = -0x16;
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetMonitorFrequency",
                   "SUNDIALS was not built with monitoring enabled.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetMonitorFrequency(void *cvode_mem, long int nst)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMonitorFrequency", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  if (nst < 0) {
    cvProcessError(NULL, CV_ILL_INPUT, "CVODE", "CVodeSetMonitorFrequency", "step interval must be >= 0\n");
    return(CV_ILL_INPUT);
  }

  cv_mem = (CVodeMem) cvode_mem;

#ifdef SUNDIALS_BUILD_WITH_MONITORING
  cv_mem->cv_monitor_interval = nst;
  return(CV_SUCCESS);
#else
  cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMonitorFrequency", "SUNDIALS was not built with monitoring enabled.");
  return(CV_ILL_INPUT);
#endif
}